

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_int_base.cpp
# Opt level: O1

string * __thiscall
sc_dt::sc_int_base::to_string_abi_cxx11_
          (string *__return_storage_ptr__,sc_int_base *this,sc_numrep numrep,bool w_prefix)

{
  int iVar1;
  word *array;
  sc_fix aa;
  sc_fxcast_switch local_6c;
  sc_fxtype_params local_68;
  sc_fxnum local_50;
  
  iVar1 = this->m_len;
  local_6c.m_sw = SC_ON;
  local_68.m_wl = 0;
  local_68.m_iwl = 0;
  local_68.m_q_mode = SC_RND;
  local_68.m_o_mode = SC_SAT;
  local_68.m_n_bits = 0;
  if (0 < iVar1) {
    local_68.m_iwl = iVar1;
    local_68.m_wl = iVar1;
    local_68.m_q_mode = SC_TRN;
    local_68.m_o_mode = SC_WRAP;
    local_68.m_n_bits = 0;
    sc_fxnum::sc_fxnum(&local_50,this,&local_68,SC_TC_,&local_6c,(sc_fxnum_observer *)0x0);
    sc_fxnum::to_string_abi_cxx11_(__return_storage_ptr__,&local_50,numrep,w_prefix);
    if (local_50.m_rep != (scfx_rep *)0x0) {
      array = ((local_50.m_rep)->m_mant).m_array;
      if (array != (word *)0x0) {
        scfx_mant::free_word(array,(long)((local_50.m_rep)->m_mant).m_size);
      }
      scfx_rep::operator_delete(local_50.m_rep,0x28);
    }
    return __return_storage_ptr__;
  }
  sc_core::sc_report_handler::report
            (SC_ERROR,"total wordlength <= 0 is not valid",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/datatypes/fx/sc_fxtype_params.h"
             ,0xb4);
  sc_core::sc_abort();
}

Assistant:

const std::string
sc_int_base::to_string( sc_numrep numrep, bool w_prefix ) const
{
    int len = m_len;
    sc_fix aa( *this, len, len, SC_TRN, SC_WRAP, 0, SC_ON );
    return aa.to_string( numrep, w_prefix );
}